

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerGLSL::emit_sparse_feedback_temporaries
          (CompilerGLSL *this,uint32_t result_type_id,uint32_t id,uint32_t *feedback_id,
          uint32_t *texel_id)

{
  uint32_t uVar1;
  mapped_type *pmVar2;
  SPIRType *pSVar3;
  CompilerError *pCVar4;
  allocator local_4d;
  uint32_t id_local;
  string local_48;
  
  id_local = id;
  if ((this->options).es == true) {
    pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_48,"Sparse texture feedback is not supported on ESSL.",&local_4d);
    CompilerError::CompilerError(pCVar4,&local_48);
    __cxa_throw(pCVar4,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  ::std::__cxx11::string::string((string *)&local_48,"GL_ARB_sparse_texture2",&local_4d);
  require_extension_internal(this,&local_48);
  ::std::__cxx11::string::~string((string *)&local_48);
  pmVar2 = ::std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->extra_sub_expressions,&id_local);
  uVar1 = *pmVar2;
  if (uVar1 == 0) {
    uVar1 = ParsedIR::increase_bound_by(&(this->super_Compiler).ir,2);
    *pmVar2 = uVar1;
  }
  *feedback_id = uVar1;
  *texel_id = *pmVar2 + 1;
  pSVar3 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,result_type_id);
  if ((*(int *)&(pSVar3->super_IVariant).field_0xc == 0xf) &&
     ((pSVar3->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
      buffer_size == 2)) {
    emit_uninitialized_temporary
              (this,((pSVar3->member_types).
                     super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr)->id,
               *feedback_id);
    emit_uninitialized_temporary
              (this,(pSVar3->member_types).
                    super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr[1].id,
               *texel_id);
    return;
  }
  pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_48,"Invalid return type for sparse feedback.",&local_4d);
  CompilerError::CompilerError(pCVar4,&local_48);
  __cxa_throw(pCVar4,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void CompilerGLSL::emit_sparse_feedback_temporaries(uint32_t result_type_id, uint32_t id, uint32_t &feedback_id,
                                                    uint32_t &texel_id)
{
	// Need to allocate two temporaries.
	if (options.es)
		SPIRV_CROSS_THROW("Sparse texture feedback is not supported on ESSL.");
	require_extension_internal("GL_ARB_sparse_texture2");

	auto &temps = extra_sub_expressions[id];
	if (temps == 0)
		temps = ir.increase_bound_by(2);

	feedback_id = temps + 0;
	texel_id = temps + 1;

	auto &return_type = get<SPIRType>(result_type_id);
	if (return_type.basetype != SPIRType::Struct || return_type.member_types.size() != 2)
		SPIRV_CROSS_THROW("Invalid return type for sparse feedback.");
	emit_uninitialized_temporary(return_type.member_types[0], feedback_id);
	emit_uninitialized_temporary(return_type.member_types[1], texel_id);
}